

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcStair::~IfcStair(IfcStair *this)

{
  *(undefined8 *)&this[-1].field_0x48 = 0x836cf0;
  *(undefined8 *)&this->field_0x30 = 0x836e08;
  *(undefined8 *)&this[-1].field_0xd0 = 0x836d18;
  *(undefined8 *)&this[-1].field_0xe0 = 0x836d40;
  *(undefined8 *)&this[-1].field_0x118 = 0x836d68;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStair,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x836d90;
  *(undefined8 *)&this[-1].field_0x180 = 0x836db8;
  *(undefined8 *)this = 0x836de0;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10,*(long *)&this->field_0x20 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)&this[-1].field_0x48,&PTR_construction_vtable_24__00836e28);
  return;
}

Assistant:

IfcStair() : Object("IfcStair") {}